

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.cc
# Opt level: O0

bool xt::seq::contains(Seq *s,Object *o)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<xt::ISeq> local_60 [2];
  Object local_40;
  Object *local_20;
  Object *o_local;
  Seq *s_local;
  
  local_20 = o;
  o_local = (Object *)s;
  while( true ) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)s);
    if (!bVar1) {
      return false;
    }
    peVar2 = std::__shared_ptr_access<xt::ISeq,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<xt::ISeq,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)s
                       );
    (**peVar2->_vptr_ISeq)();
    bVar1 = Object::operator==(&local_40,o);
    Object::~Object(&local_40);
    if (bVar1) break;
    peVar2 = std::__shared_ptr_access<xt::ISeq,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<xt::ISeq,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)s
                       );
    (*peVar2->_vptr_ISeq[1])(local_60);
    std::shared_ptr<xt::ISeq>::operator=(s,local_60);
    std::shared_ptr<xt::ISeq>::~shared_ptr(local_60);
  }
  return true;
}

Assistant:

bool contains(Seq s, Object o) {
	while (s) {
		if (s->first() == o) return true;
		s = s->next();
	}
	return false;
}